

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

_tExecReaction __thiscall yactfr::internal::Vm::_execSetPktInfo(Vm *this,Instr *param_1)

{
  Size SVar1;
  Index IVar2;
  Index IVar3;
  ElementSequenceIterator *pEVar4;
  
  (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_initialized = false;
  (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_initialized = false;
  SVar1 = (this->_pos).curExpectedPktTotalLenBits;
  if (SVar1 != 0xffffffffffffffff) {
    (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_storage = SVar1;
    (this->_pos).elems.pktInfo._expectedTotalLen.super_type.m_initialized = true;
  }
  SVar1 = (this->_pos).curExpectedPktContentLenBits;
  if (SVar1 != 0xffffffffffffffff) {
    (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_storage = SVar1;
    (this->_pos).elems.pktInfo._expectedContentLen.super_type.m_initialized = true;
  }
  IVar2 = (this->_pos).headOffsetInCurPktBits;
  IVar3 = (this->_pos).curPktOffsetInElemSeqBits;
  pEVar4 = this->_it;
  pEVar4->_curElem = &(this->_pos).elems.pktInfo.super_Element;
  pEVar4->_offset = IVar2 + IVar3;
  pEVar4->_mark = pEVar4->_mark + 1;
  return FetchNextInstrAndStop;
}

Assistant:

Vm::_tExecReaction Vm::_execSetPktInfo(const Instr&)
{
    _pos.elems.pktInfo._expectedTotalLen = boost::none;
    _pos.elems.pktInfo._expectedContentLen = boost::none;

    if (_pos.curExpectedPktTotalLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedTotalLen = _pos.curExpectedPktTotalLenBits;
    }

    if (_pos.curExpectedPktContentLenBits != std::numeric_limits<Size>::max()) {
        _pos.elems.pktInfo._expectedContentLen = _pos.curExpectedPktContentLenBits;
    }
    this->_updateItForUser(_pos.elems.pktInfo);
    return _tExecReaction::FetchNextInstrAndStop;
}